

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O3

void completeHessianDiagonal(HighsOptions *options,HighsHessian *hessian)

{
  long lVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  uint uVar7;
  HighsInt HVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  uVar2 = hessian->dim_;
  uVar10 = (ulong)(int)uVar2;
  uVar7 = HighsHessian::numNz(hessian);
  if ((long)uVar10 < 1) {
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
                "Hessian has dimension %d and %d nonzeros: inserting %d zeros onto the diagonal\n",
                (ulong)uVar2,(ulong)uVar7,0);
    return;
  }
  uVar13 = 0;
  uVar17 = 0;
  do {
    iVar9 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    uVar14 = 1;
    if (iVar9 < (int)uVar7) {
      uVar14 = (uint)(uVar13 !=
                     (uint)(hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar9]);
    }
    uVar17 = uVar17 + uVar14;
    uVar13 = uVar13 + 1;
  } while (uVar10 != uVar13);
  highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros onto the diagonal\n",
              (ulong)uVar2,(ulong)uVar7,(ulong)uVar17);
  if (uVar17 != 0) {
    HVar8 = HighsHessian::numNz(hessian);
    iVar11 = HVar8 + uVar17;
    std::vector<int,_std::allocator<int>_>::resize(&hessian->index_,(long)iVar11);
    std::vector<double,_std::allocator<double>_>::resize(&hessian->value_,(long)iVar11);
    iVar9 = HighsHessian::numNz(hessian);
    piVar3 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[uVar10] = iVar11;
    if (0 < (int)uVar2) {
      piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar13 = uVar10 - 1;
        iVar16 = piVar3[uVar10 - 1];
        if (iVar16 < iVar9 + -1) {
          lVar15 = (long)iVar9;
          lVar18 = 0;
          do {
            piVar4[(long)iVar11 + lVar18 + -1] = piVar4[lVar15 + lVar18 + -1];
            pdVar5[(long)iVar11 + lVar18 + -1] = pdVar5[lVar15 + lVar18 + -1];
            iVar16 = piVar3[uVar13];
            lVar1 = lVar15 + lVar18;
            lVar18 = lVar18 + -1;
          } while ((long)iVar16 < lVar1 + -2);
          iVar11 = iVar11 + (int)lVar18;
        }
        iVar12 = iVar11;
        if (iVar16 < iVar9) {
          uVar2 = piVar4[iVar16];
          iVar12 = iVar11 + -1;
          piVar4[(long)iVar11 + -1] = uVar2;
          pdVar5[(long)iVar11 + -1] = pdVar5[iVar16];
          iVar11 = iVar12;
          if (uVar13 != uVar2) goto LAB_002f2913;
        }
        else {
LAB_002f2913:
          iVar11 = iVar12 + -1;
          piVar4[(long)iVar12 + -1] = (int)uVar13;
          pdVar5[(long)iVar12 + -1] = 0.0;
        }
        iVar9 = piVar3[uVar13];
        piVar3[uVar13] = iVar11;
        bVar6 = 1 < (long)uVar10;
        uVar10 = uVar13;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

void completeHessianDiagonal(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Count the number of missing diagonal entries
  HighsInt num_missing_diagonal_entries = 0;
  const HighsInt dim = hessian.dim_;
  const HighsInt num_nz = hessian.numNz();
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    if (iEl < num_nz) {
      if (hessian.index_[iEl] != iCol) num_missing_diagonal_entries++;
    } else {
      num_missing_diagonal_entries++;
    }
  }
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros "
              "onto the diagonal\n",
              (int)dim, (int)num_nz, (int)num_missing_diagonal_entries);
  assert(num_missing_diagonal_entries >= dim - num_nz);
  if (!num_missing_diagonal_entries) return;
  // There are missing diagonal entries to be inserted as explicit zeros
  const HighsInt new_num_nz = hessian.numNz() + num_missing_diagonal_entries;
  HighsInt to_iEl = new_num_nz;
  hessian.index_.resize(new_num_nz);
  hessian.value_.resize(new_num_nz);
  HighsInt next_start = hessian.numNz();
  hessian.start_[dim] = to_iEl;
  HighsInt num_missing_diagonal_entries_added = 0;
  for (HighsInt iCol = dim - 1; iCol >= 0; iCol--) {
    // Shift the entries that are sure to be off-diagonal
    for (HighsInt iEl = next_start - 1; iEl > hessian.start_[iCol]; iEl--) {
      assert(hessian.index_[iEl] != iCol);
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
    }
    // Now consider any first entry. If there is none, or if it's not
    // the diagonal, then there is no diagonal entry for this column
    bool no_diagonal_entry;
    if (hessian.start_[iCol] < next_start) {
      const HighsInt iEl = hessian.start_[iCol];
      // Copy the first entry
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
      // If the first entry isn't the diagonal, then there is no
      // diagonal entry for this column
      no_diagonal_entry = hessian.index_[iEl] != iCol;
    } else {
      no_diagonal_entry = true;
    }
    if (no_diagonal_entry) {
      // There is no diagonal entry, so have insert an explicit zero
      to_iEl--;
      hessian.index_[to_iEl] = iCol;
      hessian.value_[to_iEl] = 0;
      num_missing_diagonal_entries_added++;
      assert(num_missing_diagonal_entries_added <=
             num_missing_diagonal_entries);
    }
    next_start = hessian.start_[iCol];
    hessian.start_[iCol] = to_iEl;
  }
  assert(to_iEl == 0);
}